

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

SharedSyPtr front::symbol::IntSymbol::getHolderIntSymbol(void)

{
  int iVar1;
  IntSymbol *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SharedSyPtr SVar2;
  allocator<char> local_39;
  string local_38;
  
  if (getHolderIntSymbol()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&getHolderIntSymbol()::holder);
    if (iVar1 != 0) {
      this = (IntSymbol *)operator_new(0x40);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"holder",&local_39);
      IntSymbol(this,&local_38,-1,true,0);
      std::__shared_ptr<front::symbol::Symbol,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<front::symbol::IntSymbol,void>
                ((__shared_ptr<front::symbol::Symbol,(__gnu_cxx::_Lock_policy)2> *)
                 &getHolderIntSymbol::holder,this);
      std::__cxx11::string::~string((string *)&local_38);
      __cxa_atexit(std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&getHolderIntSymbol::holder,&__dso_handle);
      __cxa_guard_release(&getHolderIntSymbol()::holder);
    }
  }
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             &getHolderIntSymbol::holder.
              super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
  SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedSyPtr)SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SharedSyPtr getHolderIntSymbol() {
    static SharedSyPtr holder(
        new IntSymbol("holder", Symbol::getNoLayerNum(), true));
    return holder;
  }